

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O0

void __thiscall amrex::Amr::coarseTimeStep(Amr *this,Real stop_time)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  int *piVar4;
  pointer pAVar5;
  double *pdVar6;
  Long LVar7;
  Amr *in_RDI;
  literals *this_00;
  longdouble x;
  undefined8 in_XMM0_Qa;
  Real RVar8;
  double dVar9;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  int packed_data [4];
  FILE *fp;
  int to_small_plot;
  int to_plot;
  int to_checkpoint;
  int to_stop;
  Real next_chk_time;
  Real eps;
  int num_per_new;
  int num_per_old;
  int check_test;
  Long max_fab_kilobytes;
  Long min_fab_kilobytes;
  int istep;
  int IOProc;
  int post_regrid_flag;
  stringstream stepName;
  double run_strt;
  double run_stop;
  undefined4 in_stack_fffffffffffff758;
  undefined4 uVar10;
  int in_stack_fffffffffffff75c;
  Vector<double,_std::allocator<double>_> *x_00;
  undefined4 uVar11;
  undefined2 in_stack_fffffffffffff760;
  undefined2 in_stack_fffffffffffff762;
  undefined4 in_stack_fffffffffffff764;
  ostream *in_stack_fffffffffffff788;
  Print *in_stack_fffffffffffff790;
  allocator *paVar12;
  Print *in_stack_fffffffffffff7d0;
  Amr *in_stack_fffffffffffff7f0;
  allocator local_6e9;
  string local_6e8;
  int local_6c8;
  int local_6c4;
  int local_6c0;
  int local_6bc;
  FILE *local_6b0;
  int local_6a8;
  int local_6a4;
  int local_6a0;
  int local_69c;
  double local_698;
  double local_690;
  int local_684;
  int local_680;
  int local_67c;
  long local_368;
  long local_360;
  undefined1 local_351;
  int local_1c8;
  int local_1c4;
  undefined4 local_1c0;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  double local_28;
  double local_20;
  undefined8 local_18;
  
  local_18 = in_XMM0_Qa;
  std::__cxx11::stringstream::stringstream(local_1b0);
  poVar3 = std::operator<<(local_1a0,"timeStep STEP ");
  piVar4 = Vector<int,_std::allocator<int>_>::operator[]
                     ((Vector<int,_std::allocator<int>_> *)
                      CONCAT44(in_stack_fffffffffffff764,
                               CONCAT22(in_stack_fffffffffffff762,in_stack_fffffffffffff760)),
                      CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
  std::ostream::operator<<(poVar3,*piVar4);
  local_28 = second();
  iVar2 = levelSteps((Amr *)CONCAT44(in_stack_fffffffffffff764,
                                     CONCAT22(in_stack_fffffffffffff762,in_stack_fffffffffffff760)),
                     in_stack_fffffffffffff75c);
  if (iVar2 < 1) {
    Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffff764,
                             CONCAT22(in_stack_fffffffffffff762,in_stack_fffffffffffff760)),
                 CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
    pAVar5 = std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::operator->
                       ((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> *)
                        0x10eb4fc);
    (*pAVar5->_vptr_AmrLevel[0xd])
              (local_18,pAVar5,
               (ulong)*(uint *)&(in_RDI->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c,
               (ulong)(uint)in_RDI->sub_cycle,&in_RDI->n_cycle,
               &(in_RDI->super_AmrCore).super_AmrMesh.super_AmrInfo.ref_ratio,&in_RDI->dt_level);
    x_00 = (Vector<double,_std::allocator<double>_> *)
           CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758);
  }
  else {
    local_1c0 = 0;
    Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffff764,
                             CONCAT22(in_stack_fffffffffffff762,in_stack_fffffffffffff760)),
                 CONCAT44(in_stack_fffffffffffff75c,in_stack_fffffffffffff758));
    pAVar5 = std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::operator->
                       ((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> *)
                        0x10eb45e);
    x_00 = &in_RDI->dt_level;
    in_stack_fffffffffffff760 = (undefined2)local_1c0;
    in_stack_fffffffffffff762 = (undefined2)((uint)local_1c0 >> 0x10);
    (*pAVar5->_vptr_AmrLevel[0xe])
              (local_18,pAVar5,
               (ulong)*(uint *)&(in_RDI->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c,
               (ulong)(uint)in_RDI->sub_cycle,&in_RDI->n_cycle,
               &(in_RDI->super_AmrCore).super_AmrMesh.super_AmrInfo.ref_ratio,&in_RDI->dt_min);
  }
  (*(in_RDI->super_AmrCore).super_AmrMesh._vptr_AmrMesh[0x11])(in_RDI->cumtime,local_18,in_RDI,0,1);
  pdVar6 = Vector<double,_std::allocator<double>_>::operator[]
                     ((Vector<double,_std::allocator<double>_> *)
                      CONCAT44(in_stack_fffffffffffff764,
                               CONCAT22(in_stack_fffffffffffff762,in_stack_fffffffffffff760)),
                      (size_type)x_00);
  in_RDI->cumtime = in_RDI->cumtime + *pdVar6;
  Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
  ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                *)CONCAT44(in_stack_fffffffffffff764,
                           CONCAT22(in_stack_fffffffffffff762,in_stack_fffffffffffff760)),
               (size_type)x_00);
  pAVar5 = std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::operator->
                     ((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> *)
                      0x10eb5cf);
  (*pAVar5->_vptr_AmrLevel[0x11])(in_RDI->cumtime);
  if (0 < (in_RDI->super_AmrCore).super_AmrMesh.super_AmrInfo.verbose) {
    local_1c4 = ParallelDescriptor::IOProcessorNumber();
    local_20 = second();
    local_20 = local_20 - local_28;
    piVar4 = Vector<int,_std::allocator<int>_>::operator[]
                       ((Vector<int,_std::allocator<int>_> *)
                        CONCAT44(in_stack_fffffffffffff764,
                                 CONCAT22(in_stack_fffffffffffff762,in_stack_fffffffffffff760)),
                        (size_type)x_00);
    local_1c8 = *piVar4;
    ParallelDescriptor::ReduceRealMax<double>(&local_20,local_1c4);
    OutStream();
    Print::Print(in_stack_fffffffffffff790,in_stack_fffffffffffff788);
    Print::operator<<((Print *)CONCAT44(in_stack_fffffffffffff764,
                                        CONCAT22(in_stack_fffffffffffff762,in_stack_fffffffffffff760
                                                )),(char (*) [8])x_00);
    Print::operator<<((Print *)CONCAT44(in_stack_fffffffffffff764,
                                        CONCAT22(in_stack_fffffffffffff762,in_stack_fffffffffffff760
                                                )),(int *)x_00);
    Print::operator<<((Print *)CONCAT44(in_stack_fffffffffffff764,
                                        CONCAT22(in_stack_fffffffffffff762,in_stack_fffffffffffff760
                                                )),(char (*) [25])x_00);
    Print::operator<<((Print *)CONCAT44(in_stack_fffffffffffff764,
                                        CONCAT22(in_stack_fffffffffffff762,in_stack_fffffffffffff760
                                                )),(double *)x_00);
    local_351 = 10;
    Print::operator<<((Print *)CONCAT44(in_stack_fffffffffffff764,
                                        CONCAT22(in_stack_fffffffffffff762,in_stack_fffffffffffff760
                                                )),(char *)x_00);
    Print::~Print(in_stack_fffffffffffff7d0);
    LVar7 = TotalBytesAllocatedInFabsHWM();
    if (LVar7 < 0) {
      LVar7 = LVar7 + 0x3ff;
    }
    local_368 = LVar7 >> 10;
    local_360 = local_368;
    ParallelDescriptor::ReduceLongMin(&local_360,local_1c4);
    ParallelDescriptor::ReduceLongMax(&local_368,local_1c4);
    OutStream();
    Print::Print(in_stack_fffffffffffff790,in_stack_fffffffffffff788);
    Print::operator<<((Print *)CONCAT44(in_stack_fffffffffffff764,
                                        CONCAT22(in_stack_fffffffffffff762,in_stack_fffffffffffff760
                                                )),(char (*) [7])x_00);
    Print::operator<<((Print *)CONCAT44(in_stack_fffffffffffff764,
                                        CONCAT22(in_stack_fffffffffffff762,in_stack_fffffffffffff760
                                                )),(int *)x_00);
    Print::operator<<((Print *)CONCAT44(in_stack_fffffffffffff764,
                                        CONCAT22(in_stack_fffffffffffff762,in_stack_fffffffffffff760
                                                )),(char (*) [42])x_00);
    Print::operator<<((Print *)CONCAT44(in_stack_fffffffffffff764,
                                        CONCAT22(in_stack_fffffffffffff762,in_stack_fffffffffffff760
                                                )),(long *)x_00);
    Print::operator<<((Print *)CONCAT44(in_stack_fffffffffffff764,
                                        CONCAT22(in_stack_fffffffffffff762,in_stack_fffffffffffff760
                                                )),(char (*) [6])x_00);
    Print::operator<<((Print *)CONCAT44(in_stack_fffffffffffff764,
                                        CONCAT22(in_stack_fffffffffffff762,in_stack_fffffffffffff760
                                                )),(long *)x_00);
    Print::operator<<((Print *)CONCAT44(in_stack_fffffffffffff764,
                                        CONCAT22(in_stack_fffffffffffff762,in_stack_fffffffffffff760
                                                )),(char (*) [3])x_00);
    Print::~Print(in_stack_fffffffffffff7d0);
  }
  if (0 < (in_RDI->super_AmrCore).super_AmrMesh.super_AmrInfo.verbose) {
    OutStream();
    Print::Print(in_stack_fffffffffffff790,in_stack_fffffffffffff788);
    Print::operator<<((Print *)CONCAT44(in_stack_fffffffffffff764,
                                        CONCAT22(in_stack_fffffffffffff762,in_stack_fffffffffffff760
                                                )),(char (*) [9])x_00);
    Vector<int,_std::allocator<int>_>::operator[]
              ((Vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffff764,
                        CONCAT22(in_stack_fffffffffffff762,in_stack_fffffffffffff760)),
               (size_type)x_00);
    Print::operator<<((Print *)CONCAT44(in_stack_fffffffffffff764,
                                        CONCAT22(in_stack_fffffffffffff762,in_stack_fffffffffffff760
                                                )),(int *)x_00);
    Print::operator<<((Print *)CONCAT44(in_stack_fffffffffffff764,
                                        CONCAT22(in_stack_fffffffffffff762,in_stack_fffffffffffff760
                                                )),(char (*) [9])x_00);
    Print::operator<<((Print *)CONCAT44(in_stack_fffffffffffff764,
                                        CONCAT22(in_stack_fffffffffffff762,in_stack_fffffffffffff760
                                                )),(double *)x_00);
    Print::operator<<((Print *)CONCAT44(in_stack_fffffffffffff764,
                                        CONCAT22(in_stack_fffffffffffff762,in_stack_fffffffffffff760
                                                )),(char (*) [7])x_00);
    Vector<double,_std::allocator<double>_>::operator[]
              ((Vector<double,_std::allocator<double>_> *)
               CONCAT44(in_stack_fffffffffffff764,
                        CONCAT22(in_stack_fffffffffffff762,in_stack_fffffffffffff760)),
               (size_type)x_00);
    Print::operator<<((Print *)CONCAT44(in_stack_fffffffffffff764,
                                        CONCAT22(in_stack_fffffffffffff762,in_stack_fffffffffffff760
                                                )),(double *)x_00);
    Print::operator<<((Print *)CONCAT44(in_stack_fffffffffffff764,
                                        CONCAT22(in_stack_fffffffffffff762,in_stack_fffffffffffff760
                                                )),(char (*) [3])x_00);
    Print::~Print(in_stack_fffffffffffff7d0);
  }
  if ((in_RDI->record_run_info != 0) && (bVar1 = ParallelDescriptor::IOProcessor(), bVar1)) {
    poVar3 = std::operator<<((ostream *)&in_RDI->runlog,"STEP = ");
    piVar4 = Vector<int,_std::allocator<int>_>::operator[]
                       ((Vector<int,_std::allocator<int>_> *)
                        CONCAT44(in_stack_fffffffffffff764,
                                 CONCAT22(in_stack_fffffffffffff762,in_stack_fffffffffffff760)),
                        (size_type)x_00);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*piVar4);
    poVar3 = std::operator<<(poVar3," TIME = ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_RDI->cumtime);
    poVar3 = std::operator<<(poVar3," DT = ");
    pdVar6 = Vector<double,_std::allocator<double>_>::operator[]
                       ((Vector<double,_std::allocator<double>_> *)
                        CONCAT44(in_stack_fffffffffffff764,
                                 CONCAT22(in_stack_fffffffffffff762,in_stack_fffffffffffff760)),
                        (size_type)x_00);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pdVar6);
    std::operator<<(poVar3,'\n');
  }
  if ((in_RDI->record_run_info_terse != 0) && (bVar1 = ParallelDescriptor::IOProcessor(), bVar1)) {
    piVar4 = Vector<int,_std::allocator<int>_>::operator[]
                       ((Vector<int,_std::allocator<int>_> *)
                        CONCAT44(in_stack_fffffffffffff764,
                                 CONCAT22(in_stack_fffffffffffff762,in_stack_fffffffffffff760)),
                        (size_type)x_00);
    poVar3 = (ostream *)std::ostream::operator<<(&in_RDI->runlog_terse,*piVar4);
    poVar3 = std::operator<<(poVar3," ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,in_RDI->cumtime);
    poVar3 = std::operator<<(poVar3," ");
    pdVar6 = Vector<double,_std::allocator<double>_>::operator[]
                       ((Vector<double,_std::allocator<double>_> *)
                        CONCAT44(in_stack_fffffffffffff764,
                                 CONCAT22(in_stack_fffffffffffff762,in_stack_fffffffffffff760)),
                        (size_type)x_00);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,*pdVar6);
    std::operator<<(poVar3,'\n');
  }
  local_67c = 0;
  if (0.0 < in_RDI->check_per) {
    dVar9 = in_RDI->cumtime;
    this_00 = (literals *)&in_RDI->dt_level;
    pdVar6 = Vector<double,_std::allocator<double>_>::operator[]
                       ((Vector<double,_std::allocator<double>_> *)
                        CONCAT44(in_stack_fffffffffffff764,
                                 CONCAT22(in_stack_fffffffffffff762,in_stack_fffffffffffff760)),
                        (size_type)x_00);
    local_680 = (int)((dVar9 - *pdVar6) / in_RDI->check_per);
    local_684 = (int)(in_RDI->cumtime / in_RDI->check_per);
    in_stack_fffffffffffff7f0 = (Amr *)std::numeric_limits<double>::epsilon();
    x = (longdouble)10.0;
    uVar10 = SUB104(x,0);
    uVar11 = (undefined4)((unkuint10)x >> 0x20);
    in_stack_fffffffffffff760 = (undefined2)((unkuint10)x >> 0x40);
    RVar8 = literals::operator____rt(this_00,x);
    iVar2 = (int)this_00;
    dVar9 = (double)in_stack_fffffffffffff7f0 * RVar8;
    std::abs(iVar2);
    local_690 = dVar9 * extraout_XMM0_Qa;
    local_698 = (double)(local_680 + 1) * in_RDI->check_per;
    if ((local_684 == local_680) && (std::abs(iVar2), extraout_XMM0_Qa_00 <= local_690)) {
      local_684 = local_684 + 1;
    }
    if (local_684 != local_680) {
      iVar2 = (int)in_RDI + 0x150;
      Vector<double,_std::allocator<double>_>::operator[]
                ((Vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_fffffffffffff764,
                          CONCAT22(in_stack_fffffffffffff762,in_stack_fffffffffffff760)),
                 CONCAT44(uVar11,uVar10));
      std::abs(iVar2);
      if (extraout_XMM0_Qa_01 <= local_690) {
        local_680 = local_680 + 1;
      }
    }
    x_00 = (Vector<double,_std::allocator<double>_> *)CONCAT44(uVar11,uVar10);
    if (local_680 != local_684) {
      local_67c = 1;
    }
  }
  local_69c = 0;
  local_6a0 = 0;
  local_6a4 = 0;
  local_6a8 = 0;
  if ((0 < in_RDI->message_int) &&
     (piVar4 = Vector<int,_std::allocator<int>_>::operator[]
                         ((Vector<int,_std::allocator<int>_> *)
                          CONCAT44(in_stack_fffffffffffff764,
                                   CONCAT22(in_stack_fffffffffffff762,in_stack_fffffffffffff760)),
                          (size_type)x_00), *piVar4 % in_RDI->message_int == 0)) {
    bVar1 = ParallelDescriptor::IOProcessor();
    if (bVar1) {
      local_6b0 = fopen("dump_and_continue","r");
      if (local_6b0 == (FILE *)0x0) {
        local_6b0 = fopen("stop_run","r");
        if (local_6b0 == (FILE *)0x0) {
          local_6b0 = fopen("dump_and_stop","r");
          if (local_6b0 != (FILE *)0x0) {
            remove("dump_and_stop");
            local_6a0 = 1;
            local_69c = 1;
            fclose(local_6b0);
          }
        }
        else {
          remove("stop_run");
          local_69c = 1;
          fclose(local_6b0);
        }
      }
      else {
        remove("dump_and_continue");
        local_6a0 = 1;
        fclose(local_6b0);
      }
      local_6b0 = fopen("plot_and_continue","r");
      if (local_6b0 != (FILE *)0x0) {
        remove("plot_and_continue");
        local_6a4 = 1;
        fclose(local_6b0);
      }
      local_6b0 = fopen("small_plot_and_continue","r");
      if (local_6b0 != (FILE *)0x0) {
        remove("small_plot_and_continue");
        local_6a8 = 1;
        fclose(local_6b0);
      }
    }
    local_6c8 = local_69c;
    local_6c4 = local_6a0;
    local_6c0 = local_6a4;
    local_6bc = local_6a8;
    iVar2 = ParallelDescriptor::IOProcessorNumber();
    ParallelDescriptor::Bcast<int>(&local_6c8,4,iVar2);
    local_69c = local_6c8;
    local_6a0 = local_6c4;
    local_6a4 = local_6c0;
    local_6a8 = local_6bc;
  }
  if ((local_69c == 1) && (local_6a0 == 0)) {
    piVar4 = Vector<int,_std::allocator<int>_>::operator[]
                       ((Vector<int,_std::allocator<int>_> *)
                        CONCAT44(in_stack_fffffffffffff764,
                                 CONCAT22(in_stack_fffffffffffff762,in_stack_fffffffffffff760)),
                        (size_type)x_00);
    in_RDI->last_checkpoint = *piVar4;
    piVar4 = Vector<int,_std::allocator<int>_>::operator[]
                       ((Vector<int,_std::allocator<int>_> *)
                        CONCAT44(in_stack_fffffffffffff764,
                                 CONCAT22(in_stack_fffffffffffff762,in_stack_fffffffffffff760)),
                        (size_type)x_00);
    in_RDI->last_plotfile = *piVar4;
  }
  if ((local_6a0 != 0) && (in_RDI->write_plotfile_with_checkpoint != 0)) {
    local_6a4 = 1;
    local_6a8 = 1;
  }
  if ((((0 < in_RDI->check_int) &&
       (piVar4 = Vector<int,_std::allocator<int>_>::operator[]
                           ((Vector<int,_std::allocator<int>_> *)
                            CONCAT44(in_stack_fffffffffffff764,
                                     CONCAT22(in_stack_fffffffffffff762,in_stack_fffffffffffff760)),
                            (size_type)x_00), *piVar4 % in_RDI->check_int == 0)) || (local_67c == 1)
      ) || (local_6a0 != 0)) {
    (*(in_RDI->super_AmrCore).super_AmrMesh._vptr_AmrMesh[0xf])();
  }
  bVar1 = writePlotNow(in_stack_fffffffffffff7f0);
  if ((bVar1) || (local_6a4 != 0)) {
    (*(in_RDI->super_AmrCore).super_AmrMesh._vptr_AmrMesh[0xd])();
  }
  bVar1 = writeSmallPlotNow(in_stack_fffffffffffff7f0);
  if ((bVar1) || (local_6a8 != 0)) {
    (*(in_RDI->super_AmrCore).super_AmrMesh._vptr_AmrMesh[0xe])();
  }
  updateInSitu(in_RDI);
  in_RDI->bUserStopRequest = local_69c != 0;
  if (local_69c != 0) {
    paVar12 = &local_6e9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_6e8,"Amr::coarseTimeStep::to_stop",paVar12);
    ParallelDescriptor::Barrier(&local_6e8);
    std::__cxx11::string::~string((string *)&local_6e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_6e9);
    bVar1 = ParallelDescriptor::IOProcessor();
    if (bVar1) {
      if (local_6a0 == 0) {
        poVar3 = ErrorStream();
        poVar3 = std::operator<<(poVar3,"Stopped by user w/o checkpoint");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
      else {
        poVar3 = ErrorStream();
        poVar3 = std::operator<<(poVar3,"Stopped by user w/ checkpoint");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
    }
  }
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return;
}

Assistant:

void
Amr::coarseTimeStep (Real stop_time)
{
    double run_stop;
    double run_strt;
    BL_PROFILE_REGION_START("Amr::coarseTimeStep()");
    BL_PROFILE("Amr::coarseTimeStep()");
    std::stringstream stepName;
    stepName << "timeStep STEP " << level_steps[0];

    run_strt = amrex::second() ;

    //
    // Compute new dt.
    //
    if (levelSteps(0) > 0)
    {
        int post_regrid_flag = 0;
        amr_level[0]->computeNewDt(finest_level,
                                   sub_cycle,
                                   n_cycle,
                                   ref_ratio,
                                   dt_min,
                                   dt_level,
                                   stop_time,
                                   post_regrid_flag);
    }
    else
    {
        amr_level[0]->computeInitialDt(finest_level,
                                       sub_cycle,
                                       n_cycle,
                                       ref_ratio,
                                       dt_level,
                                       stop_time);
    }

    BL_PROFILE_REGION_START(stepName.str());
    timeStep(0,cumtime,1,1,stop_time);
    BL_PROFILE_REGION_STOP(stepName.str());

    cumtime += dt_level[0];

    amr_level[0]->postCoarseTimeStep(cumtime);


    if (verbose > 0)
    {
        const int IOProc   = ParallelDescriptor::IOProcessorNumber();
        run_stop = amrex::second() - run_strt;
        const int istep    = level_steps[0];

#ifdef BL_LAZY
        Lazy::QueueReduction( [=] () mutable {
#endif
            ParallelDescriptor::ReduceRealMax(run_stop,IOProc);
            amrex::Print() << "\n[STEP " << istep << "] Coarse TimeStep time: " << run_stop << '\n';
#ifdef BL_LAZY
        });
#endif

#ifndef AMREX_MEM_PROFILING
        Long min_fab_kilobytes  = amrex::TotalBytesAllocatedInFabsHWM()/1024;
        Long max_fab_kilobytes  = min_fab_kilobytes;

#ifdef BL_LAZY
        Lazy::QueueReduction( [=] () mutable {
#endif
            ParallelDescriptor::ReduceLongMin(min_fab_kilobytes, IOProc);
            ParallelDescriptor::ReduceLongMax(max_fab_kilobytes, IOProc);

            amrex::Print() << "[STEP " << istep << "] FAB kilobyte spread across MPI nodes: ["
                           << min_fab_kilobytes << " ... " << max_fab_kilobytes << "]\n";
#ifdef BL_LAZY
            amrex::Print() << "\n";
            });
#endif
#endif
    }

#ifdef AMREX_MEM_PROFILING
    {
        std::ostringstream ss;
        ss << "[STEP " << level_steps[0] << "]";
        MemProfiler::report(ss.str());
    }
#endif

    BL_PROFILE_ADD_STEP(level_steps[0]);
    BL_PROFILE_REGION_STOP("Amr::coarseTimeStep()");
    BL_COMM_PROFILE_NAMETAG(stepName.str());
    //BL_PROFILE_FLUSH();
    BL_TRACE_PROFILE_FLUSH();
    BL_COMM_PROFILE_FLUSH();

    if (verbose > 0)
    {
        amrex::Print()
            << "\nSTEP = " << level_steps[0]
            << " TIME = "  << cumtime
            << " DT = "    << dt_level[0] << "\n\n";
    }
    if (record_run_info && ParallelDescriptor::IOProcessor())
    {
        runlog << "STEP = "  << level_steps[0]
               << " TIME = " << cumtime
               << " DT = "   << dt_level[0] << '\n';
    }
    if (record_run_info_terse && ParallelDescriptor::IOProcessor())
        runlog_terse << level_steps[0] << " " << cumtime << " " << dt_level[0] << '\n';

    int check_test = 0;

    if (check_per > 0.0)
    {

        // Check to see if we've crossed a check_per interval by comparing
        // the number of intervals that have elapsed for both the current
        // time and the time at the beginning of this timestep.

        int num_per_old = static_cast<int>((cumtime-dt_level[0]) / check_per);
        int num_per_new = static_cast<int>((cumtime            ) / check_per);

        // Before using these, however, we must test for the case where we're
        // within machine epsilon of the next interval. In that case, increment
        // the counter, because we have indeed reached the next check_per interval
        // at this point.

        const Real eps = std::numeric_limits<Real>::epsilon() * 10.0_rt * std::abs(cumtime);
        const Real next_chk_time = (num_per_old + 1) * check_per;

        if ((num_per_new == num_per_old) && std::abs(cumtime - next_chk_time) <= eps)
        {
            num_per_new += 1;
        }

        // Similarly, we have to account for the case where the old time is within
        // machine epsilon of the beginning of this interval, so that we don't double
        // count that time threshold -- we already plotted at that time on the last timestep.

        if ((num_per_new != num_per_old) && std::abs((cumtime - dt_level[0]) - next_chk_time) <= eps)
        {
            num_per_old += 1;
        }

        if (num_per_old != num_per_new)
        {
            check_test = 1;
        }

    }

    int to_stop       = 0;
    int to_checkpoint = 0;
    int to_plot       = 0;
    int to_small_plot = 0;
    if (message_int > 0 && level_steps[0] % message_int == 0) {
        if (ParallelDescriptor::IOProcessor())
        {
            FILE *fp;
            if ((fp=fopen("dump_and_continue","r")) != 0)
            {
                remove("dump_and_continue");
                to_checkpoint = 1;
                fclose(fp);
            }
            else if ((fp=fopen("stop_run","r")) != 0)
            {
                remove("stop_run");
                to_stop = 1;
                fclose(fp);
            }
            else if ((fp=fopen("dump_and_stop","r")) != 0)
            {
                remove("dump_and_stop");
                to_checkpoint = 1;
                to_stop = 1;
                fclose(fp);
            }

            if ((fp=fopen("plot_and_continue","r")) != 0)
            {
                remove("plot_and_continue");
                to_plot = 1;
                fclose(fp);
            }

            if ((fp=fopen("small_plot_and_continue","r")) != 0)
            {
                remove("small_plot_and_continue");
                to_small_plot = 1;
                fclose(fp);
            }
        }
        int packed_data[4];
        packed_data[0] = to_stop;
        packed_data[1] = to_checkpoint;
        packed_data[2] = to_plot;
        packed_data[3] = to_small_plot;
        ParallelDescriptor::Bcast(packed_data, 4, ParallelDescriptor::IOProcessorNumber());
        to_stop = packed_data[0];
        to_checkpoint = packed_data[1];
        to_plot = packed_data[2];
        to_small_plot = packed_data[3];

    }

    if(to_stop == 1 && to_checkpoint == 0) {  // prevent main from writing files
        last_checkpoint = level_steps[0];
        last_plotfile   = level_steps[0];
    }

    if (to_checkpoint && write_plotfile_with_checkpoint) {
        to_plot = 1;
        to_small_plot = 1;
    }

    if ((check_int > 0 && level_steps[0] % check_int == 0) || check_test == 1
        || to_checkpoint)
    {
        checkPoint();
    }


    if (writePlotNow() || to_plot)
    {
        writePlotFile();
    }

    if (writeSmallPlotNow() || to_small_plot)
    {
        writeSmallPlotFile();
    }

    updateInSitu();

    bUserStopRequest = to_stop;
    if (to_stop)
    {
        ParallelDescriptor::Barrier("Amr::coarseTimeStep::to_stop");
        if(ParallelDescriptor::IOProcessor()) {
            if (to_checkpoint)
            {
                amrex::ErrorStream() << "Stopped by user w/ checkpoint" << std::endl;
            }
            else
            {
                amrex::ErrorStream() << "Stopped by user w/o checkpoint" << std::endl;
            }
        }
    }
}